

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error,string *cmp0115Warning)

{
  cmMakefile *this_00;
  size_type sVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  PolicyStatus PVar6;
  PolicyStatus PVar7;
  cmake *this_01;
  string *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  bool bVar9;
  string err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exts;
  anon_class_56_7_c6d6a0c4 findInDir;
  undefined1 local_d0 [48];
  string local_a0;
  cmAlphaNum local_80;
  string local_50;
  
  bVar5 = GetIsGenerated(this,GlobalAndLocal);
  if (bVar5) {
    cmSourceFileLocation::DirectoryUseBinary(&this->Location);
    cmSourceFileLocation::GetFullPath_abi_cxx11_((string *)&findInDir,&this->Location);
    std::__cxx11::string::operator=((string *)&this->FullPath,(string *)&findInDir);
    std::__cxx11::string::~string((string *)&findInDir);
    this->FindFullPathFailed = false;
    return true;
  }
  if (this->FindFullPathFailed != false) {
    return false;
  }
  this_00 = (this->Location).Makefile;
  cmSourceFileLocation::GetFullPath_abi_cxx11_(&local_a0,&this->Location);
  this_01 = cmMakefile::GetCMakeInstance(this_00);
  cmake::GetAllExtensions_abi_cxx11_(&exts,this_01);
  PVar6 = cmMakefile::GetPolicyStatus(this_00,CMP0115,false);
  PVar7 = cmMakefile::GetPolicyStatus(this_00,CMP0118,false);
  findInDir.cmp0118new = WARN < PVar7;
  findInDir.lPath = &local_a0;
  findInDir.this = this;
  findInDir.exts = &exts;
  findInDir.cmp0115 = PVar6;
  findInDir.cmp0115Warning = cmp0115Warning;
  findInDir.makefile = this_00;
  if ((this->Location).AmbiguousDirectory == true) {
    psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
    bVar5 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()(&findInDir,psVar8);
    bVar9 = true;
    sVar1 = local_80.View_._M_len;
    pcVar2 = local_80.View_._M_str;
    if (bVar5) goto LAB_00271865;
    psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    bVar5 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()(&findInDir,psVar8);
    _Var3._M_p = local_a0._M_dataplus._M_p;
    sVar4 = local_a0._M_string_length;
    sVar1 = local_80.View_._M_len;
    pcVar2 = local_80.View_._M_str;
  }
  else {
    local_d0._0_8_ = local_d0 + 0x10;
    local_d0._8_8_ = (pointer)0x0;
    local_d0[0x10] = '\0';
    bVar5 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()(&findInDir,(string *)local_d0);
    std::__cxx11::string::~string((string *)local_d0);
    _Var3._M_p = local_a0._M_dataplus._M_p;
    sVar4 = local_a0._M_string_length;
    sVar1 = local_80.View_._M_len;
    pcVar2 = local_80.View_._M_str;
  }
  local_80.View_._M_len = sVar4;
  local_80.View_._M_str = _Var3._M_p;
  bVar9 = true;
  if (!bVar5) {
    local_d0._0_8_ = &DAT_0000001b;
    local_d0._8_8_ = "Cannot find source file:\n  ";
    cmStrCat<>(&err,(cmAlphaNum *)local_d0,&local_80);
    if (PVar6 < NEW) {
      local_d0._0_8_ = err._M_string_length;
      local_d0._8_8_ = err._M_dataplus._M_p;
      local_80.View_._M_len = 0x11;
      local_80.View_._M_str = "\nTried extensions";
      cmStrCat<>(&local_50,(cmAlphaNum *)local_d0,&local_80);
      std::__cxx11::string::operator=((string *)&err,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      for (; exts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             exts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          exts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               exts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        local_d0._0_8_ = err._M_string_length;
        local_d0._8_8_ = err._M_dataplus._M_p;
        local_80.View_._M_len = 2;
        local_80.View_._M_str = " .";
        cmStrCat<std::__cxx11::string>
                  (&local_50,(cmAlphaNum *)local_d0,&local_80,
                   exts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::operator=((string *)&err,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    if (error == (string *)0x0) {
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&err);
    }
    else {
      std::__cxx11::string::operator=((string *)error,(string *)&err);
    }
    this->FindFullPathFailed = true;
    std::__cxx11::string::~string((string *)&err);
    bVar9 = false;
    sVar1 = local_80.View_._M_len;
    pcVar2 = local_80.View_._M_str;
  }
LAB_00271865:
  local_80.View_._M_str = pcVar2;
  local_80.View_._M_len = sVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&exts);
  std::__cxx11::string::~string((string *)&local_a0);
  return bVar9;
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error,
                                std::string* cmp0115Warning)
{
  // If the file is generated compute the location without checking on disk.
  // Note: We also check for a locally set GENERATED property, because
  //       it might have been set before policy CMP0118 was set to NEW.
  if (this->GetIsGenerated(CheckScope::GlobalAndLocal)) {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetFullPath();
    this->FindFullPathFailed = false;
    return true;
  }

  // If this method has already failed once do not try again.
  if (this->FindFullPathFailed) {
    return false;
  }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* makefile = this->Location.GetMakefile();
  // Location path
  std::string const& lPath = this->Location.GetFullPath();
  // List of extension lists
  std::vector<std::string> exts =
    makefile->GetCMakeInstance()->GetAllExtensions();
  auto cmp0115 = makefile->GetPolicyStatus(cmPolicies::CMP0115);
  auto cmp0118 = makefile->GetPolicyStatus(cmPolicies::CMP0118);
  bool const cmp0118new =
    cmp0118 != cmPolicies::OLD && cmp0118 != cmPolicies::WARN;

  // Tries to find the file in a given directory
  auto findInDir = [this, &exts, &lPath, cmp0115, cmp0115Warning, cmp0118new,
                    makefile](std::string const& dir) -> bool {
    // Compute full path
    std::string const fullPath = cmSystemTools::CollapseFullPath(lPath, dir);
    // Try full path
    if (cmp0118new &&
        makefile->GetGlobalGenerator()->IsGeneratedFile(fullPath)) {
      this->IsGenerated = true;
    }
    if (this->IsGenerated || cmSystemTools::FileExists(fullPath)) {
      this->FullPath = fullPath;
      return true;
    }
    // This has to be an if statement due to a bug in Oracle Developer Studio.
    // See https://community.oracle.com/tech/developers/discussion/4476246/
    // for details.
    if (cmp0115 == cmPolicies::OLD || cmp0115 == cmPolicies::WARN) {
      // Try full path with extension
      for (std::string const& ext : exts) {
        if (!ext.empty()) {
          std::string extPath = cmStrCat(fullPath, '.', ext);
          if (cmp0118new &&
              makefile->GetGlobalGenerator()->IsGeneratedFile(extPath)) {
            this->IsGenerated = true;
          }
          if (this->IsGenerated || cmSystemTools::FileExists(extPath)) {
            this->FullPath = extPath;
            if (cmp0115 == cmPolicies::WARN) {
              std::string warning =
                cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0115),
                         "\nFile:\n  ", extPath);
              if (cmp0115Warning) {
                *cmp0115Warning = std::move(warning);
              } else {
                makefile->GetCMakeInstance()->IssueMessage(
                  MessageType::AUTHOR_WARNING, warning);
              }
            }
            return true;
          }
        }
      }
    }
    // File not found
    return false;
  };

  // Try to find the file in various directories
  if (this->Location.DirectoryIsAmbiguous()) {
    if (findInDir(makefile->GetCurrentSourceDirectory()) ||
        findInDir(makefile->GetCurrentBinaryDirectory())) {
      return true;
    }
  } else {
    if (findInDir({})) {
      return true;
    }
  }

  // Compose error
  std::string err = cmStrCat("Cannot find source file:\n  ", lPath);
  switch (cmp0115) {
    case cmPolicies::OLD:
    case cmPolicies::WARN:
      err = cmStrCat(err, "\nTried extensions");
      for (auto const& ext : exts) {
        err = cmStrCat(err, " .", ext);
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      break;
  }
  if (error != nullptr) {
    *error = std::move(err);
  } else {
    makefile->IssueMessage(MessageType::FATAL_ERROR, err);
  }
  this->FindFullPathFailed = true;

  // File not found
  return false;
}